

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O2

point3d * tinyusdz::geometric_normal
                    (point3d *__return_storage_ptr__,point3d *p0,point3d *p1,point3d *p2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  point3d n;
  point3d local_28;
  
  dVar1 = p1->x - p0->x;
  dVar3 = p1->y - p0->y;
  dVar4 = p1->z - p0->z;
  dVar2 = p2->y - p0->y;
  dVar5 = p2->z - p0->z;
  dVar6 = p2->x - p0->x;
  local_28.x = dVar3 * dVar5 - dVar2 * dVar4;
  local_28.y = dVar4 * dVar6 - dVar5 * dVar1;
  local_28.z = dVar1 * dVar2 - dVar6 * dVar3;
  vnormalize(__return_storage_ptr__,&local_28,2.220446049250313e-16);
  return __return_storage_ptr__;
}

Assistant:

value::point3d geometric_normal(const value::point3d &p0, const value::point3d &p1, const value::point3d &p2)
{
  value::point3d n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}